

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_0xxb_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint uVar1;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  if (quads[2] == 0) {
    uVar1 = quads[1];
    if (uVar1 == 0) {
      sh4asm_txt_rts(em);
      return;
    }
    if (uVar1 == 1) {
      sh4asm_txt_sleep(em);
      return;
    }
    if (uVar1 == 2) {
      sh4asm_txt_rte(em);
      return;
    }
  }
  sh4asm_opcode_non_inst_(quads,em);
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_0xxb_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xffff
    if (quads[2])
        goto non_inst;
    switch (quads[1]) {
    case 0:
        sh4asm_txt_rts(em);
        break;
    case 1:
        sh4asm_txt_sleep(em);
        break;
    case 2:
        sh4asm_txt_rte(em);
        break;
    default:
        goto non_inst;
    }
    return;
 non_inst:
    sh4asm_opcode_non_inst_(quads, em);
}